

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O0

char * COST_SENSITIVE::bufcache_label(label *ld,char *c)

{
  size_t sVar1;
  wclass *pwVar2;
  size_t *in_RSI;
  v_array<COST_SENSITIVE::wclass> *in_RDI;
  uint i;
  uint local_14;
  size_t *local_10;
  
  sVar1 = v_array<COST_SENSITIVE::wclass>::size(in_RDI);
  *in_RSI = sVar1;
  local_10 = in_RSI + 1;
  local_14 = 0;
  while( true ) {
    sVar1 = v_array<COST_SENSITIVE::wclass>::size(in_RDI);
    if (sVar1 <= local_14) break;
    pwVar2 = v_array<COST_SENSITIVE::wclass>::operator[](in_RDI,(ulong)local_14);
    *local_10 = *(size_t *)pwVar2;
    local_10[1] = *(size_t *)&pwVar2->partial_prediction;
    local_10 = local_10 + 2;
    local_14 = local_14 + 1;
  }
  return (char *)local_10;
}

Assistant:

char* bufcache_label(label* ld, char* c)
{
  *(size_t*)c = ld->costs.size();
  c += sizeof(size_t);
  for (unsigned int i = 0; i < ld->costs.size(); i++)
  {
    *(wclass*)c = ld->costs[i];
    c += sizeof(wclass);
  }
  return c;
}